

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsk.c
# Opt level: O1

int get_old(char *dir,FileName *varray,char *afile,char *vfile)

{
  int iVar1;
  ulong uVar2;
  size_t sVar3;
  char *pcVar4;
  uint uVar5;
  char *pcVar6;
  char *pcVar7;
  FileName *pFVar8;
  FileName *centry;
  char ver [16];
  char vbuf [16];
  int highest_p;
  char vless [4096];
  char to_file [4096];
  char name [4096];
  char local_3068 [16];
  char local_3058 [28];
  int local_303c;
  char local_3038 [4096];
  char local_2038 [4096];
  char local_1038 [4104];
  
  if (varray->version_no == 0xffffffff) {
    return 0;
  }
  strcpy(local_1038,afile);
  separate_version(local_1038,local_3068,1);
  iVar1 = get_versionless(varray,local_3038,dir);
  pcVar4 = dir;
  pcVar6 = dir;
  pFVar8 = varray;
  if (iVar1 == 0) {
    if (local_3068[0] == '\0') {
      for (; (pcVar7 = pcVar6, *pcVar6 == '/' || (pcVar7 = pcVar4, *pcVar6 != '\0'));
          pcVar6 = pcVar6 + 1) {
        pcVar4 = pcVar7;
      }
      goto LAB_0011ad05;
    }
    uVar2 = strtoul(local_3068,(char **)0x0,10);
    uVar5 = varray->version_no;
    pFVar8 = (FileName *)0x0;
    if (uVar5 != 0xffffffff) {
      do {
        pFVar8 = varray;
        if (uVar5 == (uint)uVar2) break;
        uVar5 = varray[1].version_no;
        varray = varray + 1;
        pFVar8 = (FileName *)0x0;
      } while (uVar5 != 0xffffffff);
    }
    if (pFVar8 == (FileName *)0x0) {
      return 0;
    }
    for (; (pcVar7 = pcVar6, *pcVar6 == '/' || (pcVar7 = pcVar4, *pcVar6 != '\0'));
        pcVar6 = pcVar6 + 1) {
      pcVar4 = pcVar7;
    }
LAB_0011abe8:
    if (pcVar6 + -1 == pcVar4) {
      if (pcVar4 == dir) {
        afile[0] = '/';
        afile[1] = '\0';
      }
      else {
        strcpy(afile,dir);
      }
    }
    else {
      strcpy(afile,dir);
      sVar3 = strlen(afile);
      (afile + sVar3)[0] = '/';
      (afile + sVar3)[1] = '\0';
    }
LAB_0011ad45:
    strcat(afile,pFVar8->name);
    pcVar4 = afile;
  }
  else {
    if ((varray->version_no == 0) && (varray[1].version_no == 0xffffffff)) {
      if (local_3068[0] == '\0') {
        pcVar4 = local_3038;
        strcpy(vfile,pcVar4);
        sVar3 = strlen(vfile);
        (vfile + sVar3)[0] = '.';
        (vfile + sVar3)[1] = '~';
        vfile[sVar3 + 2] = '\0';
        sVar3 = strlen(vfile);
        (vfile + sVar3)[0] = '1';
        (vfile + sVar3)[1] = '\0';
        sVar3 = strlen(vfile);
        (vfile + sVar3)[0] = '~';
        (vfile + sVar3)[1] = '\0';
        vfile = afile;
        goto LAB_0011ad50;
      }
      uVar2 = strtoul(local_3068,(char **)0x0,10);
      if ((int)uVar2 != 1) {
        return 0;
      }
      strcpy(afile,local_1038);
      sVar3 = strlen(afile);
      (afile + sVar3)[0] = '.';
      (afile + sVar3)[1] = '~';
      afile[sVar3 + 2] = '\0';
      sVar3 = strlen(afile);
      (afile + sVar3)[0] = '1';
      (afile + sVar3)[1] = '\0';
      sVar3 = strlen(afile);
      (afile + sVar3)[0] = '~';
      (afile + sVar3)[1] = '\0';
      pcVar4 = dir;
      for (pcVar6 = dir; (pcVar7 = pcVar6, *pcVar6 == '/' || (pcVar7 = pcVar4, *pcVar6 != '\0'));
          pcVar6 = pcVar6 + 1) {
        pcVar4 = pcVar7;
      }
      if (pcVar6 + -1 == pcVar4) {
        if (pcVar4 == dir) {
          vfile[0] = '/';
          vfile[1] = '\0';
        }
        else {
          strcpy(vfile,dir);
        }
      }
      else {
        strcpy(vfile,dir);
        sVar3 = strlen(vfile);
        (vfile + sVar3)[0] = '/';
        (vfile + sVar3)[1] = '\0';
      }
      strcat(vfile,afile);
    }
    else {
      iVar1 = check_vless_link(local_3038,varray,local_2038,&local_303c);
      if (iVar1 == 0) {
        return 0;
      }
      if (local_2038[0] != '\0') {
        if (local_3068[0] != '\0') {
          uVar2 = strtoul(local_3068,(char **)0x0,10);
          uVar5 = varray->version_no;
          pFVar8 = (FileName *)0x0;
          if (uVar5 != 0xffffffff) {
            do {
              pFVar8 = varray;
              if (uVar5 == (uint)uVar2) break;
              uVar5 = varray[1].version_no;
              varray = varray + 1;
              pFVar8 = (FileName *)0x0;
            } while (uVar5 != 0xffffffff);
          }
          if (pFVar8 == (FileName *)0x0) {
            return 0;
          }
          for (; (pcVar7 = pcVar6, *pcVar6 == '/' || (pcVar7 = pcVar4, *pcVar6 != '\0'));
              pcVar6 = pcVar6 + 1) {
            pcVar4 = pcVar7;
          }
          goto LAB_0011abe8;
        }
        for (; (pcVar7 = pcVar6, *pcVar6 == '/' || (pcVar7 = pcVar4, *pcVar6 != '\0'));
            pcVar6 = pcVar6 + 1) {
          pcVar4 = pcVar7;
        }
LAB_0011ad05:
        if (pcVar6 + -1 == pcVar4) {
          if (pcVar4 == dir) {
            afile[0] = '/';
            afile[1] = '\0';
          }
          else {
            strcpy(afile,dir);
          }
        }
        else {
          strcpy(afile,dir);
          sVar3 = strlen(afile);
          (afile + sVar3)[0] = '/';
          (afile + sVar3)[1] = '\0';
        }
        goto LAB_0011ad45;
      }
      if (local_3068[0] == '\0') {
        uVar2 = (ulong)(varray->version_no + 1);
      }
      else {
        uVar2 = strtoul(local_3068,(char **)0x0,10);
        if (varray->version_no + 1 != (uint)uVar2) {
          uVar5 = varray->version_no;
          while (uVar5 != 0xffffffff) {
            if (uVar5 == (uint)uVar2) goto LAB_0011ace0;
            pFVar8 = varray + 1;
            varray = varray + 1;
            uVar5 = pFVar8->version_no;
          }
          varray = (FileName *)0x0;
LAB_0011ace0:
          if (varray == (FileName *)0x0) {
            return 0;
          }
          for (; (pcVar7 = pcVar6, *pcVar6 == '/' ||
                 (pcVar7 = pcVar4, pFVar8 = varray, *pcVar6 != '\0')); pcVar6 = pcVar6 + 1) {
            pcVar4 = pcVar7;
          }
          goto LAB_0011ad05;
        }
        uVar2 = uVar2 & 0xffffffff;
      }
      sprintf(local_3058,"%u",uVar2);
      strcpy(vfile,local_3038);
      if (local_3058[0] != '\0') {
        sVar3 = strlen(vfile);
        (vfile + sVar3)[0] = '.';
        (vfile + sVar3)[1] = '~';
        vfile[sVar3 + 2] = '\0';
        strcat(vfile,local_3058);
        sVar3 = strlen(vfile);
        (vfile + sVar3)[0] = '~';
        (vfile + sVar3)[1] = '\0';
      }
    }
    pcVar4 = local_3038;
    vfile = afile;
  }
LAB_0011ad50:
  strcpy(vfile,pcVar4);
  return 1;
}

Assistant:

static int get_old(char *dir, FileName *varray, char *afile, char *vfile)
{
  char name[MAXPATHLEN], vless[MAXPATHLEN], to_file[MAXPATHLEN];
  char ver[VERSIONLEN], vbuf[VERSIONLEN];
  unsigned ver_no, max_no;
  int highest_p;
  FileName *entry;

  /* "Old" file have to be existing, thus varray should not be empty. */
  if (NoFileP(varray)) return (0);

  strcpy(name, afile);
  separate_version(name, ver, 1);

  if (get_versionless(varray, vless, dir) == 0) {
    /*
     * There is no versionless file, but at least one versioned
     * file exists.
     */
    if (*ver == '\0') {
      /*
       * No version is specified.  The highest versioned file
       * is an old file.
       */
      FindHighestVersion(varray, entry, max_no);
      ConcDirAndName(dir, entry->name, afile);
      strcpy(vfile, afile);
      return (1);
    } else {
      /*
       * A version is specified.  We have to walk thorough
       * varray and try to find the file with the specified
       * version.
       */
      ver_no = strtoul(ver, (char **)NULL, 10);
      FindSpecifiedVersion(varray, entry, ver_no);
      if (entry != NULL) {
        ConcDirAndName(dir, entry->name, afile);
        strcpy(vfile, afile);
        return (1);
      } else
        return (0);
    }
  } else if (OnlyVersionlessP(varray)) {
    /*
     * There is only versionless file in varray.
     * If the specified version is 1 the versionless file is regarded
     * as version 1 file.
     */
    if (*ver == '\0') {
      /*
       * No version is specified.  The versionless file is dealt
       * with as version 1.
       */
      ConcNameAndVersion(vless, "1", vfile);
      strcpy(afile, vless);
      return (1);
    } else {
      ver_no = strtoul(ver, (char **)NULL, 10);
      if (ver_no == 1) {
        /*
         * Version 1 is specified.  The versionless file is
         * dealt with as a version 1 file.
         */
        ConcNameAndVersion(name, "1", afile);
        ConcDirAndName(dir, afile, vfile);
        strcpy(afile, vless);
        return (1);
      } else {
        /*
         * Other versions than 1 are not recognized as an old
         * file.
         */
        return (0);
      }
    }
  } else {
    if (check_vless_link(vless, varray, to_file, &highest_p) == 0) return (0);
    if (*to_file == '\0') {
      /*
       * There is a versionless file in varray and at least one
       * versioned file exists.  The versionless file is not linked
       * to any file in varray.
       */
      if (*ver == '\0') {
        /*
         * No version is specified.  The one higher than an
         * existing maximum version is dealt with as the
         * old version, and it should be a version of the
         * link missing versionless file.
         */
        FindHighestVersion(varray, entry, max_no);
        sprintf(vbuf, "%u", max_no + 1);
        ConcNameAndVersion(vless, vbuf, vfile);
        strcpy(afile, vless);
        return (1);
      } else {
        /* A version is specified. */
        ver_no = strtoul(ver, (char **)NULL, 10);
        FindHighestVersion(varray, entry, max_no);
        if (ver_no == max_no + 1) {
          /*
           * If the version is one higher than the
           * existing highest version is specified, it
           * is dealt with as a version of the link
           * missing versionless file.
           */
          sprintf(vbuf, "%u", ver_no);
          ConcNameAndVersion(vless, vbuf, vfile);
          strcpy(afile, vless);
          return (1);
        } else {
          /*
           * We have to walk through varray and try
           * to find the file with the specified version.
           */
          FindSpecifiedVersion(varray, entry, ver_no);
          if (entry != NULL) {
            ConcDirAndName(dir, entry->name, afile);
            strcpy(vfile, afile);
            return (1);
          } else
            return (0);
        }
      }
    } else {
      /*
       * There is a versionless file in varray and at least one
       * versioned file exists.  The versionless file is linked to
       * one of files in varray.
       */
      if (*ver == '\0') {
        /*
         * No version is specified.  The highest versioned file
         * in varray is an old file.
         */
        FindHighestVersion(varray, entry, max_no);
        ConcDirAndName(dir, entry->name, afile);
        strcpy(vfile, afile);
        return (1);
      } else {
        /*
         * A version is specified.  We have to walk thorough
         * varray and try to find the file with the specified
         * version.
         */
        ver_no = strtoul(ver, (char **)NULL, 10);
        FindSpecifiedVersion(varray, entry, ver_no);
        if (entry != NULL) {
          ConcDirAndName(dir, entry->name, afile);
          strcpy(vfile, afile);
          return (1);
        } else
          return (0);
      }
    }
  }
}